

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall dynet::AdadeltaTrainer::restart(AdadeltaTrainer *this)

{
  bool bVar1;
  reference pSVar2;
  long in_RDI;
  ShadowLookupParameters slp_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_> *__range1_3;
  ShadowLookupParameters slp;
  iterator __end1_2;
  iterator __begin1_2;
  vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_> *__range1_2;
  ShadowParameters sp_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *__range1_1;
  ShadowParameters sp;
  iterator __end1;
  iterator __begin1;
  vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *__range1;
  ShadowLookupParameters *in_stack_fffffffffffffe38;
  ShadowLookupParameters *in_stack_fffffffffffffe40;
  ShadowLookupParameters local_1a8;
  ShadowLookupParameters *local_150;
  __normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
  local_148;
  long local_140;
  ShadowLookupParameters *local_d0;
  __normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
  local_c8;
  long local_c0;
  undefined1 local_b8 [64];
  ShadowParameters *local_78;
  __normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
  local_70;
  long local_68;
  undefined1 local_60 [64];
  ShadowParameters *local_20;
  __normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
  local_18;
  long local_10;
  
  local_10 = in_RDI + 0x38;
  local_18._M_current =
       (ShadowParameters *)
       std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::begin
                 ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)
                  in_stack_fffffffffffffe38);
  local_20 = (ShadowParameters *)
             std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::end
                       ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *
                        )in_stack_fffffffffffffe38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
             ::operator*(&local_18);
    memcpy(local_60,pSVar2,0x40);
    TensorTools::zero((Tensor *)0xdb345c);
    __gnu_cxx::
    __normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
    ::operator++(&local_18);
  }
  local_68 = in_RDI + 0x68;
  local_70._M_current =
       (ShadowParameters *)
       std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::begin
                 ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)
                  in_stack_fffffffffffffe38);
  local_78 = (ShadowParameters *)
             std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::end
                       ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *
                        )in_stack_fffffffffffffe38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
             ::operator*(&local_70);
    memcpy(local_b8,pSVar2,0x40);
    TensorTools::zero((Tensor *)0xdb34f0);
    __gnu_cxx::
    __normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
    ::operator++(&local_70);
  }
  local_c0 = in_RDI + 0x50;
  local_c8._M_current =
       (ShadowLookupParameters *)
       std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
       begin(in_stack_fffffffffffffe38);
  local_d0 = (ShadowLookupParameters *)
             std::
             vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
             end((vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                  *)in_stack_fffffffffffffe38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
    ::operator*(&local_c8);
    ShadowLookupParameters::ShadowLookupParameters
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    TensorTools::zero((Tensor *)0xdb3581);
    ShadowLookupParameters::~ShadowLookupParameters((ShadowLookupParameters *)0xdb3590);
    __gnu_cxx::
    __normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
    ::operator++(&local_c8);
  }
  local_140 = in_RDI + 0x80;
  local_148._M_current =
       (ShadowLookupParameters *)
       std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
       begin(in_stack_fffffffffffffe38);
  local_150 = (ShadowLookupParameters *)
              std::
              vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
              ::end((vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                     *)in_stack_fffffffffffffe38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
    ::operator*(&local_148);
    in_stack_fffffffffffffe40 = &local_1a8;
    ShadowLookupParameters::ShadowLookupParameters
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    TensorTools::zero((Tensor *)0xdb3640);
    ShadowLookupParameters::~ShadowLookupParameters((ShadowLookupParameters *)0xdb364c);
    __gnu_cxx::
    __normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
    ::operator++(&local_148);
  }
  return;
}

Assistant:

void AdadeltaTrainer::restart() {
  for (auto sp : hg)
    TensorTools::zero(sp.h);
  for (auto sp : hd)
    TensorTools::zero(sp.h);
  for (auto slp : hlg)
    TensorTools::zero(slp.all_h);
  for (auto slp : hld)
    TensorTools::zero(slp.all_h);
}